

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_client_read(Curl_easy *data,char *buf,size_t blen,size_t *nread,_Bool *eos)

{
  Curl_creader *pCVar1;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  ulong uVar4;
  
  if (((data->req).reader_stack != (Curl_creader *)0x0) ||
     (CVar3 = Curl_creader_set_fread(data,(data->state).infilesize), CVar3 == CURLE_OK)) {
    pCVar1 = (data->req).reader_stack;
    *nread = 0;
    *eos = false;
    if (pCVar1 == (Curl_creader *)0x0) {
      uVar4 = 0x1a;
    }
    else {
      CVar3 = (*pCVar1->crt->do_read)(data,pCVar1,buf,blen,nread,eos);
      uVar4 = (ulong)CVar3;
    }
    CVar3 = (CURLcode)uVar4;
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"client_read(len=%zu) -> %d, nread=%zu, eos=%d",blen,uVar4,*nread,
                    (ulong)*eos);
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_client_read(struct Curl_easy *data, char *buf, size_t blen,
                          size_t *nread, bool *eos)
{
  CURLcode result;

  DEBUGASSERT(buf);
  DEBUGASSERT(blen);
  DEBUGASSERT(nread);
  DEBUGASSERT(eos);

  if(!data->req.reader_stack) {
    result = Curl_creader_set_fread(data, data->state.infilesize);
    if(result)
      return result;
    DEBUGASSERT(data->req.reader_stack);
  }

  result = Curl_creader_read(data, data->req.reader_stack, buf, blen,
                             nread, eos);
  CURL_TRC_READ(data, "client_read(len=%zu) -> %d, nread=%zu, eos=%d",
                blen, result, *nread, *eos);
  return result;
}